

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_openUChars_63(UText *ut,UChar *s,int64_t length,UErrorCode *status)

{
  UBool UVar1;
  int64_t local_38;
  UErrorCode *status_local;
  int64_t length_local;
  UChar *s_local;
  UText *ut_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    length_local = (int64_t)s;
    if ((s == (UChar *)0x0) && (length == 0)) {
      length_local = (int64_t)gEmptyUString;
    }
    if (((length_local == 0) || (length < -1)) || (0x7fffffff < length)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local = (UText *)0x0;
    }
    else {
      ut_local = utext_setup_63(ut,0,status);
      UVar1 = U_SUCCESS(*status);
      if (UVar1 != '\0') {
        ut_local->pFuncs = &ucstrFuncs;
        ut_local->context = (void *)length_local;
        ut_local->providerProperties = 4;
        if (length == -1) {
          ut_local->providerProperties = ut_local->providerProperties | 2;
        }
        ut_local->a = length;
        ut_local->chunkContents = (UChar *)length_local;
        ut_local->chunkNativeStart = 0;
        local_38 = length;
        if (length < 0) {
          local_38 = 0;
        }
        ut_local->chunkNativeLimit = local_38;
        ut_local->chunkLength = (int32_t)ut_local->chunkNativeLimit;
        ut_local->chunkOffset = 0;
        ut_local->nativeIndexingLimit = ut_local->chunkLength;
      }
    }
  }
  else {
    ut_local = (UText *)0x0;
  }
  return ut_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_openUChars(UText *ut, const UChar *s, int64_t length, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return NULL;
    }
    if(s==NULL && length==0) {
        s = gEmptyUString;
    }
    if (s==NULL || length < -1 || length>INT32_MAX) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    ut = utext_setup(ut, 0, status);
    if (U_SUCCESS(*status)) {
        ut->pFuncs               = &ucstrFuncs;
        ut->context              = s;
        ut->providerProperties   = I32_FLAG(UTEXT_PROVIDER_STABLE_CHUNKS);
        if (length==-1) {
            ut->providerProperties |= I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
        }
        ut->a                    = length;
        ut->chunkContents        = s;
        ut->chunkNativeStart     = 0;
        ut->chunkNativeLimit     = length>=0? length : 0;
        ut->chunkLength          = (int32_t)ut->chunkNativeLimit;
        ut->chunkOffset          = 0;
        ut->nativeIndexingLimit  = ut->chunkLength;
    }
    return ut;
}